

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O2

void __thiscall OpenMD::GenericData::~GenericData(GenericData *this)

{
  ~GenericData(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~GenericData() {}